

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O0

void __thiscall uint256_tests::from_user_hex::test_method(from_user_hex *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  string_view str_21;
  string_view str_22;
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffed18;
  uint256 *in_stack_ffffffffffffed20;
  char *in_stack_ffffffffffffed28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed30;
  undefined7 in_stack_ffffffffffffed38;
  undefined1 in_stack_ffffffffffffed3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed40;
  char *in_stack_ffffffffffffed48;
  char *__rhs;
  undefined7 in_stack_ffffffffffffed50;
  undefined1 in_stack_ffffffffffffed57;
  lazy_ostream *in_stack_ffffffffffffed58;
  char *in_stack_ffffffffffffed60;
  undefined7 in_stack_ffffffffffffed68;
  undefined1 in_stack_ffffffffffffed6f;
  size_t in_stack_ffffffffffffed70;
  char *in_stack_ffffffffffffed78;
  from_user_hex *this_local;
  const_string local_f48 [2];
  lazy_ostream local_f28 [2];
  assertion_result local_f08 [2];
  const_string local_ed0 [2];
  lazy_ostream local_eb0 [2];
  assertion_result local_e90 [2];
  const_string local_e58 [2];
  lazy_ostream local_e38 [2];
  assertion_result local_e18 [2];
  const_string local_de0 [2];
  lazy_ostream local_dc0 [2];
  assertion_result local_da0 [2];
  const_string local_d68 [2];
  lazy_ostream local_d48 [3];
  assertion_result local_d18 [2];
  const_string local_ce0 [2];
  lazy_ostream local_cc0 [3];
  assertion_result local_c90 [2];
  const_string local_c58 [2];
  lazy_ostream local_c38 [3];
  assertion_result local_c08 [2];
  const_string local_bd0 [2];
  lazy_ostream local_bb0 [3];
  assertion_result local_b80 [2];
  const_string local_b48 [2];
  lazy_ostream local_b28 [3];
  assertion_result local_af8 [2];
  const_string local_ac0 [2];
  lazy_ostream local_aa0 [3];
  assertion_result local_a70 [2];
  const_string local_a38 [2];
  lazy_ostream local_a18 [3];
  assertion_result local_9e8 [2];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [64];
  undefined1 local_960 [16];
  undefined1 local_950 [68];
  lazy_ostream local_90c;
  undefined1 local_8f0 [71];
  allocator<char> local_8a9 [17];
  undefined1 local_898 [16];
  undefined1 local_888 [80];
  undefined1 local_838 [16];
  undefined1 local_828 [80];
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [80];
  undefined1 local_778 [16];
  undefined1 local_768 [80];
  undefined1 local_718 [16];
  undefined1 local_708 [80];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [80];
  undefined1 local_658 [16];
  undefined1 local_648 [80];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [80];
  undefined1 local_598 [16];
  undefined1 local_588 [640];
  lazy_ostream local_308 [6];
  undefined1 local_2a0 [64];
  lazy_ostream local_260 [6];
  undefined1 local_1f8 [32];
  string valid_hex_64;
  lazy_ostream local_1b1 [2];
  undefined1 local_191 [33];
  lazy_ostream local_170 [2];
  undefined1 local_150 [33];
  lazy_ostream local_12f [2];
  undefined1 local_10f [33];
  lazy_ostream local_ee [2];
  undefined1 local_ce [33];
  undefined1 local_ad [33];
  undefined1 local_8c [33];
  undefined1 local_6b [33];
  undefined1 local_4a [33];
  undefined1 local_29 [33];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str._M_str._0_7_ = in_stack_ffffffffffffed38;
    str._M_len = (size_t)in_stack_ffffffffffffed30;
    str._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str);
    in_stack_ffffffffffffed28 = "uint256::ZERO";
    in_stack_ffffffffffffed20 = &uint256::ZERO;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(\"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_588,local_598,0x12e,1,2,local_29);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_00._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_00._M_len = (size_t)in_stack_ffffffffffffed30;
    str_00._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_00);
    in_stack_ffffffffffffed28 = "uint256::ZERO";
    in_stack_ffffffffffffed20 = &uint256::ZERO;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(\"0x\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_5e8,local_5f8,0x12f,1,2,local_4a);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_01._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_01._M_len = (size_t)in_stack_ffffffffffffed30;
    str_01._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_01);
    in_stack_ffffffffffffed28 = "uint256::ZERO";
    in_stack_ffffffffffffed20 = &uint256::ZERO;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(\"0\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_648,local_658,0x130,1,2,local_6b);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_02._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_02._M_len = (size_t)in_stack_ffffffffffffed30;
    str_02._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_02);
    in_stack_ffffffffffffed28 = "uint256::ZERO";
    in_stack_ffffffffffffed20 = &uint256::ZERO;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(\"00\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_6a8,local_6b8,0x131,1,2,local_8c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_03._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_03._M_len = (size_t)in_stack_ffffffffffffed30;
    str_03._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_03);
    in_stack_ffffffffffffed28 = "uint256::ONE";
    in_stack_ffffffffffffed20 = &uint256::ONE;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(\"1\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_708,local_718,0x132,1,2,local_ad);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_04._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_04._M_len = (size_t)in_stack_ffffffffffffed30;
    str_04._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_04);
    uint256::uint256((uint256 *)in_stack_ffffffffffffed18,'\0');
    in_stack_ffffffffffffed28 = "uint256{0x10}";
    in_stack_ffffffffffffed20 = (uint256 *)local_ee;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(\"0x10\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_768,local_778,0x133,1,2,local_ce);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_05._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_05._M_len = (size_t)in_stack_ffffffffffffed30;
    str_05._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_05);
    uint256::uint256((uint256 *)in_stack_ffffffffffffed18,'\0');
    in_stack_ffffffffffffed28 = "uint256{0x10}";
    in_stack_ffffffffffffed20 = (uint256 *)local_12f;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(\"10\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_7c8,local_7d8,0x134,1,2,local_10f);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_06._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_06._M_len = (size_t)in_stack_ffffffffffffed30;
    str_06._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_06);
    uint256::uint256((uint256 *)in_stack_ffffffffffffed18,'\0');
    in_stack_ffffffffffffed28 = "uint256{0xff}";
    in_stack_ffffffffffffed20 = (uint256 *)local_170;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(\"0xFf\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_828,local_838,0x135,1,2,local_150);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_07._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_07._M_len = (size_t)in_stack_ffffffffffffed30;
    str_07._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_07);
    uint256::uint256((uint256 *)in_stack_ffffffffffffed18,'\0');
    in_stack_ffffffffffffed28 = "uint256{0xff}";
    in_stack_ffffffffffffed20 = (uint256 *)local_1b1;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(\"Ff\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_888,local_898,0x136,1,2,local_191);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed6f,in_stack_ffffffffffffed68),in_stack_ffffffffffffed60
             ,(allocator<char> *)in_stack_ffffffffffffed58);
  std::allocator<char>::~allocator(local_8a9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    local_90c._4_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffed18);
    local_90c._vptr_lazy_ostream._0_4_ = 0x42;
    in_stack_ffffffffffffed28 = "2 + 64";
    in_stack_ffffffffffffed20 = (uint256 *)&local_90c;
    in_stack_ffffffffffffed18 = "valid_hex_64.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_8f0,&local_90c.field_0xc,0x138,2,2,
               (undefined1 *)((long)&local_90c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffed40,
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (size_type)in_stack_ffffffffffffed30);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38));
    str_08._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_08._M_len = (size_t)in_stack_ffffffffffffed30;
    str_08._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_08);
    std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffed28);
    base_blob<256u>::ToString_abi_cxx11_(&in_stack_ffffffffffffed20->super_base_blob<256U>);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffed40,
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (size_type)in_stack_ffffffffffffed30);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38));
    str_21._M_str = in_stack_ffffffffffffed78;
    str_21._M_len = in_stack_ffffffffffffed70;
    ToLower_abi_cxx11_(str_21);
    in_stack_ffffffffffffed28 = "ToLower(valid_hex_64.substr(2))";
    in_stack_ffffffffffffed20 = (uint256 *)local_260;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(valid_hex_64.substr(2)).value().ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_950,local_960,0x139,1,2,local_1f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,(char (*) [1])in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffed40,
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (size_type)in_stack_ffffffffffffed30);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38));
    str_09._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_09._M_len = (size_t)in_stack_ffffffffffffed30;
    str_09._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_09);
    std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffed28);
    base_blob<256u>::ToString_abi_cxx11_(&in_stack_ffffffffffffed20->super_base_blob<256U>);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffed40,
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (size_type)in_stack_ffffffffffffed30);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38));
    str_22._M_str = in_stack_ffffffffffffed78;
    str_22._M_len = in_stack_ffffffffffffed70;
    ToLower_abi_cxx11_(str_22);
    in_stack_ffffffffffffed28 = "ToLower(valid_hex_64.substr(2))";
    in_stack_ffffffffffffed20 = (uint256 *)local_308;
    in_stack_ffffffffffffed18 = "uint256::FromUserHex(valid_hex_64.substr(0)).value().ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_9a0,local_9b0,0x13a,1,2,local_2a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_10._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_10._M_len = (size_t)in_stack_ffffffffffffed30;
    str_10._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_10);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9e8,local_a18,local_a38,0x13c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_11._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_11._M_len = (size_t)in_stack_ffffffffffffed30;
    str_11._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_11);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a70,local_aa0,local_ac0,0x13d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_12._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_12._M_len = (size_t)in_stack_ffffffffffffed30;
    str_12._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_12);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_af8,local_b28,local_b48,0x13e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_13._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_13._M_len = (size_t)in_stack_ffffffffffffed30;
    str_13._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_13);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b80,local_bb0,local_bd0,0x13f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_14._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_14._M_len = (size_t)in_stack_ffffffffffffed30;
    str_14._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_14);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c08,local_c38,local_c58,0x140,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_15._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_15._M_len = (size_t)in_stack_ffffffffffffed30;
    str_15._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_15);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c90,local_cc0,local_ce0,0x141,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (char *)in_stack_ffffffffffffed30);
    str_16._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_16._M_len = (size_t)in_stack_ffffffffffffed30;
    str_16._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_16);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d18,local_d48,local_d68,0x142,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffed40,
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38),
               (size_type)in_stack_ffffffffffffed30);
    std::operator+(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38));
    str_17._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_17._M_len = (size_t)in_stack_ffffffffffffed30;
    str_17._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_17);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_da0,local_dc0,local_de0,0x143,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
                   in_stack_ffffffffffffed48);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38));
    str_18._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_18._M_len = (size_t)in_stack_ffffffffffffed30;
    str_18._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_18);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e18,local_e38,local_e58,0x144,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)in_stack_ffffffffffffed48,(const_string *)in_stack_ffffffffffffed40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
                   in_stack_ffffffffffffed48);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38));
    str_19._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_19._M_len = (size_t)in_stack_ffffffffffffed30;
    str_19._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_19);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    in_stack_ffffffffffffed58 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e90,local_eb0,local_ed0,0x145,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed57 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffed57);
  do {
    __rhs = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffed58,
               (const_string *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
               (size_t)__rhs,(const_string *)in_stack_ffffffffffffed40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),__rhs);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffed3f,in_stack_ffffffffffffed38));
    str_20._M_str._0_7_ = in_stack_ffffffffffffed38;
    str_20._M_len = (size_t)in_stack_ffffffffffffed30;
    str_20._M_str._7_1_ = in_stack_ffffffffffffed3f;
    uint256::FromUserHex(str_20);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffed28,
               SUB81((ulong)in_stack_ffffffffffffed20 >> 0x38,0));
    in_stack_ffffffffffffed40 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffed20,
               (basic_cstring<const_char> *)in_stack_ffffffffffffed18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffed28,
               (pointer)in_stack_ffffffffffffed20,(unsigned_long)in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed18 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f08,local_f28,local_f48,0x146,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffed18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffed18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed18);
    in_stack_ffffffffffffed3f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffed3f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffed18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(from_user_hex)
{
    BOOST_CHECK_EQUAL(uint256::FromUserHex(""), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0x"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("00"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("1"), uint256::ONE);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0x10"), uint256{0x10});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("10"), uint256{0x10});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0xFf"), uint256{0xff});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("Ff"), uint256{0xff});
    const std::string valid_hex_64{"0x0123456789abcdef0123456789abcdef0123456789ABDCEF0123456789ABCDEF"};
    BOOST_REQUIRE_EQUAL(valid_hex_64.size(), 2 + 64); // 0x prefix and 64 hex digits
    BOOST_CHECK_EQUAL(uint256::FromUserHex(valid_hex_64.substr(2)).value().ToString(), ToLower(valid_hex_64.substr(2)));
    BOOST_CHECK_EQUAL(uint256::FromUserHex(valid_hex_64.substr(0)).value().ToString(), ToLower(valid_hex_64.substr(2)));

    BOOST_CHECK(!uint256::FromUserHex("0x0 "));                       // no spaces at end,
    BOOST_CHECK(!uint256::FromUserHex(" 0x0"));                       // or beginning,
    BOOST_CHECK(!uint256::FromUserHex("0x 0"));                       // or middle,
    BOOST_CHECK(!uint256::FromUserHex(" "));                          // etc.
    BOOST_CHECK(!uint256::FromUserHex("0x0ga"));                      // invalid character
    BOOST_CHECK(!uint256::FromUserHex("x0"));                         // broken prefix
    BOOST_CHECK(!uint256::FromUserHex("0x0x00"));                     // two prefixes not allowed
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64.substr(2) + "0")); // 1 hex digit too many
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + "a"));           // 1 hex digit too many
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + " "));           // whitespace after max length
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + "z"));           // invalid character after max length
}